

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_finalizeDictionary
                 (void *dictBuffer,size_t dictBufferCapacity,void *customDictContent,
                 size_t dictContentSize,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                 ZDICT_params_t params)

{
  U32 UVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  void *__s;
  void *__dest;
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  uint in_stack_00000014;
  BYTE *outDictContent;
  BYTE *outDictPadding;
  BYTE *outDictHeader;
  size_t dictSize;
  size_t eSize;
  U32 dictID;
  U32 compliantID;
  U64 randomID;
  size_t paddingSize;
  size_t minContentSize;
  U32 notificationLevel;
  int compressionLevel;
  BYTE header [256];
  size_t hSize;
  uint in_stack_0000317c;
  size_t *in_stack_00003180;
  void *in_stack_00003188;
  int in_stack_00003194;
  size_t in_stack_00003198;
  void *in_stack_000031a0;
  void *in_stack_000031c0;
  size_t in_stack_000031c8;
  uint in_stack_000031d0;
  size_t in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  size_t local_160;
  undefined1 local_148 [264];
  size_t local_40;
  ulong local_28;
  void *local_20;
  ulong local_18;
  void *local_10;
  size_t local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  UVar1 = ZDICT_maxRep(repStartValue);
  uVar4 = (ulong)UVar1;
  if (local_18 < local_28) {
    local_8 = 0xffffffffffffffba;
  }
  else if (local_18 < 0x100) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    MEM_writeLE32(in_stack_fffffffffffffe40,(U32)(in_stack_fffffffffffffe38 >> 0x20));
    XXH_INLINE_XXH64(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0x2fd7eb);
    MEM_writeLE32(in_stack_fffffffffffffe40,(U32)(in_stack_fffffffffffffe38 >> 0x20));
    local_40 = 8;
    if (1 < in_stack_00000014) {
      fprintf(_stderr,"\r%70s\r","");
      fflush(_stderr);
      fprintf(_stderr,"statistics ... \n");
      fflush(_stderr);
    }
    sVar3 = ZDICT_analyzeEntropy
                      (in_stack_000031a0,in_stack_00003198,in_stack_00003194,in_stack_00003188,
                       in_stack_00003180,in_stack_0000317c,in_stack_000031c0,in_stack_000031c8,
                       in_stack_000031d0);
    uVar2 = ZDICT_isError(0x2fd927);
    local_8 = sVar3;
    if (uVar2 == 0) {
      local_40 = sVar3 + local_40;
      if (local_18 < local_40 + local_28) {
        local_28 = local_18 - local_40;
      }
      if (local_28 < uVar4) {
        if (local_18 < local_40 + uVar4) {
          return 0xffffffffffffffba;
        }
        local_160 = uVar4 - local_28;
      }
      else {
        local_160 = 0;
      }
      uVar4 = local_40 + local_160 + local_28;
      __s = (void *)((long)local_10 + local_40);
      __dest = (void *)((long)__s + local_160);
      if (local_18 < uVar4) {
        __assert_fail("dictSize <= dictBufferCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cc,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      if ((long)__dest + local_28 != (long)local_10 + uVar4) {
        __assert_fail("outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cd,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      memmove(__dest,local_20,local_28);
      memcpy(local_10,local_148,local_40);
      memset(__s,0,local_160);
      local_8 = uVar4;
    }
  }
  return local_8;
}

Assistant:

size_t ZDICT_finalizeDictionary(void* dictBuffer, size_t dictBufferCapacity,
                          const void* customDictContent, size_t dictContentSize,
                          const void* samplesBuffer, const size_t* samplesSizes,
                          unsigned nbSamples, ZDICT_params_t params)
{
    size_t hSize;
#define HBUFFSIZE 256   /* should prove large enough for all entropy headers */
    BYTE header[HBUFFSIZE];
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    /* The final dictionary content must be at least as large as the largest repcode */
    size_t const minContentSize = (size_t)ZDICT_maxRep(repStartValue);
    size_t paddingSize;

    /* check conditions */
    DEBUGLOG(4, "ZDICT_finalizeDictionary");
    if (dictBufferCapacity < dictContentSize) return ERROR(dstSize_tooSmall);
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) return ERROR(dstSize_tooSmall);

    /* dictionary header */
    MEM_writeLE32(header, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64(customDictContent, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32(header+4, dictID);
    }
    hSize = 8;

    /* entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy(header+hSize, HBUFFSIZE-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  customDictContent, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* Shrink the content size if it doesn't fit in the buffer */
    if (hSize + dictContentSize > dictBufferCapacity) {
        dictContentSize = dictBufferCapacity - hSize;
    }

    /* Pad the dictionary content with zeros if it is too small */
    if (dictContentSize < minContentSize) {
        RETURN_ERROR_IF(hSize + minContentSize > dictBufferCapacity, dstSize_tooSmall,
                        "dictBufferCapacity too small to fit max repcode");
        paddingSize = minContentSize - dictContentSize;
    } else {
        paddingSize = 0;
    }

    {
        size_t const dictSize = hSize + paddingSize + dictContentSize;

        /* The dictionary consists of the header, optional padding, and the content.
         * The padding comes before the content because the "best" position in the
         * dictionary is the last byte.
         */
        BYTE* const outDictHeader = (BYTE*)dictBuffer;
        BYTE* const outDictPadding = outDictHeader + hSize;
        BYTE* const outDictContent = outDictPadding + paddingSize;

        assert(dictSize <= dictBufferCapacity);
        assert(outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize);

        /* First copy the customDictContent into its final location.
         * `customDictContent` and `dictBuffer` may overlap, so we must
         * do this before any other writes into the output buffer.
         * Then copy the header & padding into the output buffer.
         */
        memmove(outDictContent, customDictContent, dictContentSize);
        memcpy(outDictHeader, header, hSize);
        memset(outDictPadding, 0, paddingSize);

        return dictSize;
    }
}